

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCast::Operation<float,int>(float input,int32_t *result,bool strict)

{
  bool bVar1;
  
  bVar1 = NumericTryCast::Operation<float,int>(input,result,strict);
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, int32_t &result, bool strict) {
	return NumericTryCast::Operation<float, int32_t>(input, result, strict);
}